

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tga.cpp
# Opt level: O3

void embree::storeTga(Ref<embree::Image> *img,FileName *fileName)

{
  long lVar1;
  Image *pIVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  fstream file;
  float local_258;
  float fStack_254;
  float fStack_250;
  undefined4 uStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  undefined4 uStack_23c;
  long local_238 [2];
  char local_228 [12];
  undefined4 auStack_21c [125];
  
  std::fstream::fstream(local_238);
  lVar1 = *(long *)(local_238[0] + -0x18);
  *(undefined4 *)((long)auStack_21c + lVar1) = 5;
  std::ios::clear((int)&local_258 + (int)lVar1 + 0x20);
  std::fstream::open((char *)local_238,(_Ios_Openmode)(fileName->filename)._M_dataplus._M_p);
  local_258 = (float)((uint)local_258 & 0xffffff00);
  std::ostream::write(local_228,(long)&local_258);
  local_258 = (float)((uint)local_258 & 0xffffff00);
  std::ostream::write(local_228,(long)&local_258);
  local_258 = (float)CONCAT31(local_258._1_3_,2);
  std::ostream::write(local_228,(long)&local_258);
  local_258 = (float)((uint)local_258 & 0xffff0000);
  std::ostream::write(local_228,(long)&local_258);
  local_258 = (float)((uint)local_258 & 0xffff0000);
  std::ostream::write(local_228,(long)&local_258);
  local_258 = (float)((uint)local_258 & 0xffffff00);
  std::ostream::write(local_228,(long)&local_258);
  local_258 = (float)((uint)local_258 & 0xffff0000);
  std::ostream::write(local_228,(long)&local_258);
  local_258 = (float)((uint)local_258 & 0xffff0000);
  std::ostream::write(local_228,(long)&local_258);
  local_258._0_2_ = (short)img->ptr->width;
  std::ostream::write(local_228,(long)&local_258);
  local_258 = (float)CONCAT22(local_258._2_2_,(short)img->ptr->height);
  std::ostream::write(local_228,(long)&local_258);
  local_258._0_1_ = 0x18;
  std::ostream::write(local_228,(long)&local_258);
  local_258 = (float)CONCAT31(local_258._1_3_,0x20);
  std::ostream::write(local_228,(long)&local_258);
  pIVar2 = img->ptr;
  if (pIVar2->height != 0) {
    uVar4 = 0;
    do {
      if (pIVar2->width != 0) {
        uVar3 = 0;
        do {
          (*(pIVar2->super_RefCount)._vptr_RefCount[4])(&local_258,pIVar2,uVar3,uVar4);
          local_248 = local_258;
          fStack_244 = fStack_254;
          fStack_240 = fStack_250;
          uStack_23c = uStack_24c;
          fVar5 = fStack_250;
          if (1.0 <= fStack_250) {
            fVar5 = 1.0;
          }
          fVar6 = 0.0;
          if (0.0 <= fVar5) {
            fVar6 = fVar5;
          }
          local_258._0_1_ = (char)(int)(fVar6 * 255.0);
          std::ostream::write(local_228,(long)&local_258);
          fVar5 = fStack_244;
          if (1.0 <= fStack_244) {
            fVar5 = 1.0;
          }
          fVar6 = 0.0;
          if (0.0 <= fVar5) {
            fVar6 = fVar5;
          }
          local_258._0_1_ = (undefined1)(int)(fVar6 * 255.0);
          std::ostream::write(local_228,(long)&local_258);
          fVar5 = local_248;
          if (1.0 <= local_248) {
            fVar5 = 1.0;
          }
          fVar6 = 0.0;
          if (0.0 <= fVar5) {
            fVar6 = fVar5;
          }
          local_258 = (float)CONCAT31(local_258._1_3_,(char)(int)(fVar6 * 255.0));
          std::ostream::write(local_228,(long)&local_258);
          uVar3 = uVar3 + 1;
          pIVar2 = img->ptr;
        } while (uVar3 < pIVar2->width);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < pIVar2->height);
  }
  std::fstream::~fstream(local_238);
  return;
}

Assistant:

void storeTga(const Ref<Image>& img, const FileName& fileName)
  {
    /* open file for reading */
    std::fstream file;
    file.exceptions (std::fstream::failbit | std::fstream::badbit);
    file.open (fileName.c_str(), std::fstream::out | std::fstream::binary);

    fwrite_uchar(0x00, file);
    fwrite_uchar(0x00, file);
    fwrite_uchar(0x02, file);
    fwrite_ushort(0x0000, file);
    fwrite_ushort(0x0000, file);
    fwrite_uchar(0x00, file);
    fwrite_ushort(0x0000, file);
    fwrite_ushort(0x0000, file);
    fwrite_ushort((unsigned short)img->width , file);
    fwrite_ushort((unsigned short)img->height, file);
    fwrite_uchar(0x18, file);
    fwrite_uchar(0x20, file);

    for (size_t y=0; y<img->height; y++) {
      for (size_t x=0; x<img->width; x++) {
        Color c = img->get(x,y);
        fwrite_uchar((unsigned char)(clamp(c.b)*255.0f), file);
        fwrite_uchar((unsigned char)(clamp(c.g)*255.0f), file);
        fwrite_uchar((unsigned char)(clamp(c.r)*255.0f), file);
      }
    }
  }